

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::reset(CompilerGLSL *this,uint32_t iteration_count)

{
  CompilerError *this_00;
  anon_class_1_0_00000001 local_4f;
  anon_class_1_0_00000001 local_4e;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [36];
  uint32_t local_14;
  CompilerGLSL *pCStack_10;
  uint32_t iteration_count_local;
  CompilerGLSL *this_local;
  
  local_14 = iteration_count;
  pCStack_10 = this;
  if (((this->options).force_recompile_max_debug_iterations <= iteration_count) &&
     (((this->super_Compiler).is_force_recompile_forward_progress & 1U) == 0)) {
    local_4d = 1;
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_38,
               "Maximum compilation loops detected and no forward progress was made. Must be a SPIRV-Cross bug!"
               ,&local_39);
    CompilerError::CompilerError(this_00,(string *)local_38);
    local_4d = 0;
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  Compiler::clear_force_recompile(&this->super_Compiler);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&(this->super_Compiler).invalid_expressions);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this->composite_insert_overwritten);
  (this->super_Compiler).current_function = (SPIRFunction *)0x0;
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::clear(&this->expression_usage_counts);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&(this->super_Compiler).forwarded_temporaries);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&(this->super_Compiler).suppressed_usage_tracking);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this->flushed_phi_variables);
  SmallVector<spirv_cross::SPIRBlock_*,_8UL>::clear(&this->current_emitting_switch_stack);
  reset_name_caches(this);
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRFunction,spirv_cross::CompilerGLSL::reset(unsigned_int)::__0>
            (&(this->super_Compiler).ir,&local_4e);
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::reset(unsigned_int)::__1>
            (&(this->super_Compiler).ir,&local_4f);
  ParsedIR::reset_all_of_type<spirv_cross::SPIRExpression>(&(this->super_Compiler).ir);
  ParsedIR::reset_all_of_type<spirv_cross::SPIRAccessChain>(&(this->super_Compiler).ir);
  this->statement_count = 0;
  this->indent = 0;
  (this->super_Compiler).current_loop_level = 0;
  return;
}

Assistant:

void CompilerGLSL::reset(uint32_t iteration_count)
{
	// Sanity check the iteration count to be robust against a certain class of bugs where
	// we keep forcing recompilations without making clear forward progress.
	// In buggy situations we will loop forever, or loop for an unbounded number of iterations.
	// Certain types of recompilations are considered to make forward progress,
	// but in almost all situations, we'll never see more than 3 iterations.
	// It is highly context-sensitive when we need to force recompilation,
	// and it is not practical with the current architecture
	// to resolve everything up front.
	if (iteration_count >= options.force_recompile_max_debug_iterations && !is_force_recompile_forward_progress)
		SPIRV_CROSS_THROW("Maximum compilation loops detected and no forward progress was made. Must be a SPIRV-Cross bug!");

	// We do some speculative optimizations which should pretty much always work out,
	// but just in case the SPIR-V is rather weird, recompile until it's happy.
	// This typically only means one extra pass.
	clear_force_recompile();

	// Clear invalid expression tracking.
	invalid_expressions.clear();
	composite_insert_overwritten.clear();
	current_function = nullptr;

	// Clear temporary usage tracking.
	expression_usage_counts.clear();
	forwarded_temporaries.clear();
	suppressed_usage_tracking.clear();

	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	flushed_phi_variables.clear();

	current_emitting_switch_stack.clear();

	reset_name_caches();

	ir.for_each_typed_id<SPIRFunction>([&](uint32_t, SPIRFunction &func) {
		func.active = false;
		func.flush_undeclared = true;
	});

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) { var.dependees.clear(); });

	ir.reset_all_of_type<SPIRExpression>();
	ir.reset_all_of_type<SPIRAccessChain>();

	statement_count = 0;
	indent = 0;
	current_loop_level = 0;
}